

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::CeilCase::compare(CeilCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  bool bVar5;
  uint uVar6;
  float fVar7;
  ostream *poVar8;
  deUint32 aBits;
  uint uVar9;
  ostringstream *poVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  int iVar14;
  ulong uVar15;
  deUint32 bBits;
  float fVar16;
  float fVar17;
  float fVar18;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar6 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    if ((int)uVar6 < 1) {
      return true;
    }
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar15 = 0;
    do {
      local_34.value = ceilf(*(float *)((long)pvVar3 + uVar15 * 4));
      fVar16 = *(float *)((long)pvVar4 + uVar15 * 4);
      if (PVar1 == PRECISION_HIGHP) {
LAB_014d1bee:
        fVar13 = local_34.value - (int)fVar16;
        if ((uint)local_34.value < (uint)fVar16) {
          fVar13 = (float)-((int)local_34.value - (int)fVar16);
        }
      }
      else if ((fVar16 != 0.0) || (NAN(fVar16))) {
        if ((local_34.value != 0.0) || (NAN(local_34.value))) goto LAB_014d1bee;
        fVar13 = ABS(fVar16);
      }
      else {
        fVar13 = ABS(local_34.value);
      }
      if (fVar13 != 0.0) {
        poVar10 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar10->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = ",4);
        poVar8 = Functional::operator<<(poVar8,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", got ULP diff ",0xf);
LAB_014d1e91:
        local_40.value = (deUint64)(uint)fVar13;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar8);
        return false;
      }
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
  }
  else {
    uVar9 = -1 << (0x17 - (&DAT_01c9ed3c)[(ulong)PVar1 * 4] & 0x1f);
    if ((int)uVar6 < 1) {
      return true;
    }
    fVar13 = (float)~uVar9;
    fVar16 = (float)(uVar9 & 0x7fffff ^ 0x3fffffff) + -1.0;
    pvVar3 = *inputs;
    pvVar4 = *outputs;
    uVar15 = 0;
    do {
      fVar18 = *(float *)((long)pvVar3 + uVar15 * 4);
      fVar7 = *(float *)((long)pvVar4 + uVar15 * 4);
      fVar17 = ceilf(fVar18 - fVar16);
      iVar12 = (int)fVar17;
      fVar18 = ceilf(fVar18 + fVar16);
      iVar14 = (int)fVar18;
      if (iVar14 < iVar12) {
        bVar5 = false;
      }
      else {
        bVar5 = false;
        iVar11 = iVar12;
        do {
          fVar18 = (float)iVar11;
          if ((fVar7 != 0.0) || (NAN(fVar7))) {
            fVar17 = ABS(fVar7);
            if (iVar11 != 0) {
              fVar17 = (float)((int)fVar18 - (int)fVar7);
              if ((uint)fVar18 < (uint)fVar7) {
                fVar17 = (float)-((int)fVar18 - (int)fVar7);
              }
            }
          }
          else {
            fVar17 = ABS(fVar18);
          }
          if ((uint)fVar17 <= (uint)fVar13) {
            bVar5 = true;
            break;
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 <= iVar14);
      }
      if (((!bVar5) && (iVar12 < 1)) && (-1 < iVar14)) {
        fVar7 = (float)((int)fVar7 + -0x80000000);
        fVar18 = (float)-(int)fVar7;
        if (0 < (int)fVar7) {
          fVar18 = fVar7;
        }
        bVar5 = (uint)fVar18 <= (uint)fVar13;
      }
      if (!bVar5) {
        poVar10 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar10->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar8 = (ostream *)std::ostream::operator<<(poVar10,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] = [",5);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,", ",2);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] with ULP threshold ",0x15);
        goto LAB_014d1e91;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar6);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= deFloatCeil(in0);

				const deUint32	ulpDiff		= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(deFloatCeil(in0-eps));
				const int		maxRes		= int(deFloatCeil(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk && de::inRange(0, minRes, maxRes))
				{
					// Allow -0 as well.
					const int ulpDiff = de::abs((int)tcu::Float32(out0).bits() - (int)0x80000000u);
					anyOk = ((deUint32)ulpDiff <= maxUlpDiff);
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}